

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O0

void __thiscall
duckdb::TableStatistics::InitializeAddConstraint(TableStatistics *this,TableStatistics *parent)

{
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *pvVar1;
  reference __x;
  long in_RSI;
  shared_ptr<std::mutex,_true> *in_RDI;
  idx_t i;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  shared_ptr<std::mutex,_true> *in_stack_ffffffffffffffb0;
  shared_ptr<std::mutex,_true> *in_stack_ffffffffffffffc0;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *this_00;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *local_20;
  
  shared_ptr<std::mutex,_true>::operator=(in_RDI,in_stack_ffffffffffffffc0);
  shared_ptr<std::mutex,_true>::operator*(in_stack_ffffffffffffffb0);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_20 = (vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
              *)0x0;
  while( true ) {
    this_00 = local_20;
    pvVar1 = (vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
              *)::std::
                vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                ::size((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                        *)(in_RSI + 0x10));
    if (pvVar1 <= this_00) break;
    __x = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                    ((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *)
                     (in_RDI + 1),(size_type)in_stack_ffffffffffffffa8);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
    ::push_back(this_00,__x);
    local_20 = (vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                *)((long)&(local_20->
                          super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xbbb5a6);
  return;
}

Assistant:

void TableStatistics::InitializeAddConstraint(TableStatistics &parent) {
	D_ASSERT(Empty());
	D_ASSERT(parent.stats_lock);

	stats_lock = parent.stats_lock;
	lock_guard<mutex> lock(*stats_lock);
	for (idx_t i = 0; i < parent.column_stats.size(); i++) {
		column_stats.push_back(parent.column_stats[i]);
	}
}